

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keypoint_approach.cpp
# Opt level: O0

void keypoint_approach(Mat *image_model,Mat *image_test)

{
  bool bVar1;
  type *keypoint_test_00;
  type *ptVar2;
  _InputArray *p_Var3;
  _InputArray local_650;
  allocator<char> local_631;
  string local_630 [39];
  allocator<char> local_609;
  string local_608 [32];
  _InputArray local_5e8;
  allocator<char> local_5c9;
  string local_5c8 [39];
  allocator<char> local_5a1;
  string local_5a0 [32];
  _InputArray local_580;
  allocator<char> local_561;
  string local_560 [39];
  allocator<char> local_539;
  string local_538 [32];
  _Vector_impl local_518;
  Scalar_<double> local_500;
  Scalar_<double> local_4e0;
  _InputOutputArray local_4c0;
  _InputArray local_4a8;
  _InputArray local_490;
  Scalar_<double> local_478;
  _InputOutputArray local_458;
  _InputArray local_440;
  Scalar_<double> local_428;
  _InputOutputArray local_408;
  _InputArray local_3f0;
  Mat local_3d8 [8];
  Mat img_keypoint_matches;
  Mat local_378 [8];
  Mat img_keypoint_test;
  Mat local_318 [8];
  Mat img_keypoint_model;
  undefined1 local_2b8 [8];
  vector<cv::DMatch,_std::allocator<cv::DMatch>_> filtered_matches;
  undefined1 local_298 [4];
  float ratio_thresh;
  _InputArray local_280;
  undefined1 local_268 [8];
  vector<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>,_std::allocator<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>_>_>
  knn_matches;
  Ptr<cv::DescriptorMatcher> local_248 [8];
  Ptr<cv::DescriptorMatcher> matcher;
  type *descriptor_test;
  type *keypoint_test;
  type *local_1b0;
  type *descriptor_model;
  type *keypoint_model;
  undefined1 local_128 [8];
  ORB_Param test_param;
  ORB_Param param_model;
  allocator<char> local_d9;
  string local_d8 [39];
  allocator<char> local_b1;
  string local_b0 [32];
  _InputArray local_90;
  allocator<char> local_71;
  string local_70 [55];
  allocator<char> local_39;
  string local_38 [32];
  Mat *local_18;
  Mat *image_test_local;
  Mat *image_model_local;
  
  local_18 = image_test;
  image_test_local = image_model;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_38,"pretreat model",&local_39);
  cv::namedWindow(local_38,0);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_70,"pretreat model",&local_71);
  cv::_InputArray::_InputArray(&local_90,image_test_local);
  cv::imshow(local_70,&local_90);
  cv::_InputArray::~_InputArray(&local_90);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator(&local_71);
  cv::waitKey(0);
  cv::destroyAllWindows();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b0,"pretreat test",&local_b1);
  cv::namedWindow(local_b0,0);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator(&local_b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_d8,"pretreat test",&local_d9);
  cv::_InputArray::_InputArray((_InputArray *)&param_model.patchSize,local_18);
  cv::imshow(local_d8,(_InputArray *)&param_model.patchSize);
  cv::_InputArray::~_InputArray((_InputArray *)&param_model.patchSize);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator(&local_d9);
  cv::waitKey(0);
  cv::destroyAllWindows();
  ORB_Param::ORB_Param((ORB_Param *)&test_param.patchSize);
  ORB_Param::ORB_Param((ORB_Param *)local_128);
  test_param.patchSize = 10000;
  local_128._0_4_ = 10000;
  test_param.fastThreshold = 4;
  test_param.nfeature = 100;
  keypoint_compute((pair<std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>,_cv::Mat> *)
                   &keypoint_model,image_test_local,(ORB_Param *)&test_param.patchSize);
  descriptor_model =
       (type *)std::get<0ul,std::vector<cv::KeyPoint,std::allocator<cv::KeyPoint>>,cv::Mat>
                         ((pair<std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>,_cv::Mat> *
                          )&keypoint_model);
  local_1b0 = std::get<1ul,std::vector<cv::KeyPoint,std::allocator<cv::KeyPoint>>,cv::Mat>
                        ((pair<std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>,_cv::Mat> *)
                         &keypoint_model);
  keypoint_compute((pair<std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>,_cv::Mat> *)
                   &keypoint_test,local_18,(ORB_Param *)local_128);
  keypoint_test_00 =
       std::get<0ul,std::vector<cv::KeyPoint,std::allocator<cv::KeyPoint>>,cv::Mat>
                 ((pair<std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>,_cv::Mat> *)
                  &keypoint_test);
  ptVar2 = std::get<1ul,std::vector<cv::KeyPoint,std::allocator<cv::KeyPoint>>,cv::Mat>
                     ((pair<std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>,_cv::Mat> *)
                      &keypoint_test);
  knn_matches.
  super__Vector_base<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>,_std::allocator<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 4;
  cv::DescriptorMatcher::create((MatcherType *)local_248);
  std::
  vector<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>,_std::allocator<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>_>_>
  ::vector((vector<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>,_std::allocator<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>_>_>
            *)local_268);
  p_Var3 = (_InputArray *)cv::Ptr<cv::DescriptorMatcher>::operator->(local_248);
  cv::_InputArray::_InputArray(&local_280,local_1b0);
  cv::_InputArray::_InputArray((_InputArray *)local_298,ptVar2);
  bVar1 = (bool)cv::noArray();
  cv::DescriptorMatcher::knnMatch
            (p_Var3,&local_280,(vector *)local_298,(int)local_268,(_InputArray *)0x2,bVar1);
  cv::_InputArray::~_InputArray((_InputArray *)local_298);
  cv::_InputArray::~_InputArray(&local_280);
  filtered_matches.super__Vector_base<cv::DMatch,_std::allocator<cv::DMatch>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0x3f400000;
  filter_match((vector<cv::DMatch,_std::allocator<cv::DMatch>_> *)local_2b8,
               (vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *)descriptor_model,
               keypoint_test_00,
               (vector<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>,_std::allocator<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>_>_>
                *)local_268,0.75);
  cv::Mat::Mat(local_318);
  cv::Mat::Mat(local_378);
  cv::Mat::Mat(local_3d8);
  cv::_InputArray::_InputArray(&local_3f0,image_test_local);
  ptVar2 = descriptor_model;
  cv::_InputOutputArray::_InputOutputArray(&local_408,local_318);
  cv::Scalar_<double>::Scalar_(&local_428,0.0,255.0,0.0,0.0);
  cv::drawKeypoints(&local_3f0,ptVar2,&local_408,&local_428,0);
  cv::_InputOutputArray::~_InputOutputArray(&local_408);
  cv::_InputArray::~_InputArray(&local_3f0);
  cv::_InputArray::_InputArray(&local_440,local_18);
  cv::_InputOutputArray::_InputOutputArray(&local_458,local_378);
  cv::Scalar_<double>::Scalar_(&local_478,0.0,255.0,0.0,0.0);
  cv::drawKeypoints(&local_440,keypoint_test_00,&local_458,&local_478,0);
  cv::_InputOutputArray::~_InputOutputArray(&local_458);
  cv::_InputArray::~_InputArray(&local_440);
  cv::_InputArray::_InputArray(&local_490,image_test_local);
  ptVar2 = descriptor_model;
  cv::_InputArray::_InputArray(&local_4a8,local_18);
  cv::_InputOutputArray::_InputOutputArray(&local_4c0,local_3d8);
  cv::Scalar_<double>::all(&local_4e0,-1.0);
  cv::Scalar_<double>::all(&local_500,-1.0);
  local_518.super__Tp_alloc_type = (_Tp_alloc_type)0x0;
  local_518._1_7_ = 0;
  local_518._8_8_ = 0;
  local_518._16_8_ = 0;
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)&local_518);
  cv::drawMatches(&local_490,ptVar2,&local_4a8,keypoint_test_00,local_2b8,&local_4c0,&local_4e0,
                  &local_500,&local_518,0);
  std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)&local_518);
  cv::_InputOutputArray::~_InputOutputArray(&local_4c0);
  cv::_InputArray::~_InputArray(&local_4a8);
  cv::_InputArray::~_InputArray(&local_490);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_538,"Keypoint model",&local_539);
  cv::namedWindow(local_538,0);
  std::__cxx11::string::~string(local_538);
  std::allocator<char>::~allocator(&local_539);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_560,"Keypoint model",&local_561);
  cv::_InputArray::_InputArray(&local_580,local_318);
  cv::imshow(local_560,&local_580);
  cv::_InputArray::~_InputArray(&local_580);
  std::__cxx11::string::~string(local_560);
  std::allocator<char>::~allocator(&local_561);
  cv::waitKey(0);
  cv::destroyAllWindows();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_5a0,"Keypoint test",&local_5a1);
  cv::namedWindow(local_5a0,0);
  std::__cxx11::string::~string(local_5a0);
  std::allocator<char>::~allocator(&local_5a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_5c8,"Keypoint test",&local_5c9);
  cv::_InputArray::_InputArray(&local_5e8,local_378);
  cv::imshow(local_5c8,&local_5e8);
  cv::_InputArray::~_InputArray(&local_5e8);
  std::__cxx11::string::~string(local_5c8);
  std::allocator<char>::~allocator(&local_5c9);
  cv::waitKey(0);
  cv::destroyAllWindows();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_608,"Keypoint matches",&local_609);
  cv::namedWindow(local_608,0);
  std::__cxx11::string::~string(local_608);
  std::allocator<char>::~allocator(&local_609);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_630,"Keypoint matches",&local_631);
  cv::_InputArray::_InputArray(&local_650,local_3d8);
  cv::imshow(local_630,&local_650);
  cv::_InputArray::~_InputArray(&local_650);
  std::__cxx11::string::~string(local_630);
  std::allocator<char>::~allocator(&local_631);
  cv::waitKey(0);
  cv::destroyAllWindows();
  cv::Mat::~Mat(local_3d8);
  cv::Mat::~Mat(local_378);
  cv::Mat::~Mat(local_318);
  std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>::~vector
            ((vector<cv::DMatch,_std::allocator<cv::DMatch>_> *)local_2b8);
  std::
  vector<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>,_std::allocator<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>_>_>
  ::~vector((vector<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>,_std::allocator<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>_>_>
             *)local_268);
  cv::Ptr<cv::DescriptorMatcher>::~Ptr(local_248);
  std::pair<std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>,_cv::Mat>::~pair
            ((pair<std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>,_cv::Mat> *)
             &keypoint_test);
  std::pair<std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>,_cv::Mat>::~pair
            ((pair<std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>,_cv::Mat> *)
             &keypoint_model);
  return;
}

Assistant:

void keypoint_approach(const cv::Mat& image_model, const cv::Mat& image_test)
{
    cv::namedWindow("pretreat model", cv::WINDOW_NORMAL);
    cv::imshow("pretreat model", image_model);
    cv::waitKey(0);
    cv::destroyAllWindows();

    cv::namedWindow("pretreat test", cv::WINDOW_NORMAL);
    cv::imshow("pretreat test", image_test);
    cv::waitKey(0);
    cv::destroyAllWindows();

    ORB_Param param_model, test_param;
    param_model.nfeature = 10000;

    test_param.nfeature = 10000;
    // test_param.nlevels = 16;
    test_param.WTA_K = 4;
    test_param.edgeThreshold = 100;

    auto [keypoint_model, descriptor_model] = keypoint_compute(image_model, param_model);
    auto [keypoint_test, descriptor_test] = keypoint_compute(image_test, test_param);

#if CV_MAJOR_VERSION < 3
    auto matcher = cv::DescriptorMatcher::create("NORM_HAMMING");
#else
    auto matcher = cv::DescriptorMatcher::create(cv::DescriptorMatcher::BRUTEFORCE_HAMMING);
#endif

    std::vector<std::vector<cv::DMatch>> knn_matches;
    matcher->knnMatch(descriptor_model, descriptor_test, knn_matches, 2);

    const float ratio_thresh = 0.75f;
    std::vector<cv::DMatch> filtered_matches = filter_match(keypoint_model, keypoint_test, knn_matches, ratio_thresh);

    cv::Mat img_keypoint_model, img_keypoint_test, img_keypoint_matches;

    cv::drawKeypoints(image_model, keypoint_model, img_keypoint_model, cv::Scalar(0, 255, 0));
    cv::drawKeypoints(image_test, keypoint_test, img_keypoint_test, cv::Scalar(0, 255, 0));
    cv::drawMatches(image_model, keypoint_model, image_test, keypoint_test, filtered_matches, img_keypoint_matches);

    cv::namedWindow("Keypoint model", cv::WINDOW_NORMAL);
    cv::imshow("Keypoint model", img_keypoint_model);
    cv::waitKey(0);
    cv::destroyAllWindows();

    cv::namedWindow("Keypoint test", cv::WINDOW_NORMAL);
    cv::imshow("Keypoint test", img_keypoint_test);
    cv::waitKey(0);
    cv::destroyAllWindows();

    cv::namedWindow("Keypoint matches", cv::WINDOW_NORMAL);
    cv::imshow("Keypoint matches", img_keypoint_matches);
    cv::waitKey(0);
    cv::destroyAllWindows();
}